

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode_io.c
# Opt level: O0

int ARKodeSetFixedStepBounds(void *arkode_mem,sunrealtype lb,sunrealtype ub)

{
  double in_XMM0_Qa;
  double in_XMM1_Qa;
  ARKodeMem ark_mem;
  ARKodeHAdaptMem hadapt_mem;
  int retval;
  ARKodeMem in_stack_ffffffffffffffc8;
  char *in_stack_ffffffffffffffd0;
  undefined4 in_stack_ffffffffffffffd8;
  undefined4 in_stack_ffffffffffffffdc;
  int local_4;
  
  local_4 = arkAccessHAdaptMem((void *)CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8)
                               ,in_stack_ffffffffffffffd0,(ARKodeMem *)in_stack_ffffffffffffffc8,
                               (ARKodeHAdaptMem *)0x151e6e);
  if (local_4 == 0) {
    if (in_stack_ffffffffffffffc8->step_supports_adaptive == 0) {
      arkProcessError(in_stack_ffffffffffffffc8,-0x30,0x6ce,"ARKodeSetFixedStepBounds",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/opencor[P]sundials/src/arkode/arkode_io.c"
                      ,"time-stepping module does not support temporal adaptivity");
      local_4 = -0x30;
    }
    else {
      if ((1.0 < in_XMM0_Qa) || (in_XMM1_Qa < 1.0)) {
        in_stack_ffffffffffffffd0[0x48] = '\0';
        in_stack_ffffffffffffffd0[0x49] = '\0';
        in_stack_ffffffffffffffd0[0x4a] = '\0';
        in_stack_ffffffffffffffd0[0x4b] = '\0';
        in_stack_ffffffffffffffd0[0x4c] = '\0';
        in_stack_ffffffffffffffd0[0x4d] = '\0';
        in_stack_ffffffffffffffd0[0x4e] = -0x10;
        in_stack_ffffffffffffffd0[0x4f] = '?';
        in_stack_ffffffffffffffd0[0x50] = '\0';
        in_stack_ffffffffffffffd0[0x51] = '\0';
        in_stack_ffffffffffffffd0[0x52] = '\0';
        in_stack_ffffffffffffffd0[0x53] = '\0';
        in_stack_ffffffffffffffd0[0x54] = '\0';
        in_stack_ffffffffffffffd0[0x55] = '\0';
        in_stack_ffffffffffffffd0[0x56] = -8;
        in_stack_ffffffffffffffd0[0x57] = '?';
      }
      else {
        *(double *)(in_stack_ffffffffffffffd0 + 0x48) = in_XMM0_Qa;
        *(double *)(in_stack_ffffffffffffffd0 + 0x50) = in_XMM1_Qa;
      }
      local_4 = 0;
    }
  }
  return local_4;
}

Assistant:

int ARKodeSetFixedStepBounds(void* arkode_mem, sunrealtype lb, sunrealtype ub)
{
  int retval;
  ARKodeHAdaptMem hadapt_mem;
  ARKodeMem ark_mem;
  retval = arkAccessHAdaptMem(arkode_mem, __func__, &ark_mem, &hadapt_mem);
  if (retval != ARK_SUCCESS) { return (retval); }

  /* Guard against use for non-adaptive time stepper modules */
  if (!ark_mem->step_supports_adaptive)
  {
    arkProcessError(ark_mem, ARK_STEPPER_UNSUPPORTED, __LINE__, __func__,
                    __FILE__, "time-stepping module does not support temporal adaptivity");
    return (ARK_STEPPER_UNSUPPORTED);
  }

  /* set allowable interval, otherwise set defaults */
  if ((lb <= ONE) && (ub >= ONE))
  {
    hadapt_mem->lbound = lb;
    hadapt_mem->ubound = ub;
  }
  else
  {
    hadapt_mem->lbound = HFIXED_LB;
    hadapt_mem->ubound = HFIXED_UB;
  }

  return (ARK_SUCCESS);
}